

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

int ws_msg_init_control(ws_frame **framep,nni_ws *ws,uint8_t op,uint8_t *buf,size_t len)

{
  int iVar1;
  ws_frame *frame;
  
  frame = (ws_frame *)nni_zalloc(0xd8);
  if (frame == (ws_frame *)0x0) {
    iVar1 = 2;
  }
  else {
    memcpy(frame->sdata,buf,len);
    frame->len = len;
    frame->final = true;
    frame->op = (uint)op;
    frame->head[0] = op | 0x80;
    frame->head[1] = (byte)len & 0x7f;
    frame->hlen = 2;
    frame->buf = frame->sdata;
    frame->asize = 0;
    if (ws->server == true) {
      frame->masked = false;
    }
    else {
      ws_mask_frame(frame);
    }
    *framep = frame;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
ws_msg_init_control(
    ws_frame **framep, nni_ws *ws, uint8_t op, const uint8_t *buf, size_t len)
{
	ws_frame *frame;

	if (len > 125) {
		return (NNG_EINVAL);
	}

	if ((frame = NNI_ALLOC_STRUCT(frame)) == NULL) {
		return (NNG_ENOMEM);
	}

	memcpy(frame->sdata, buf, len);
	frame->len     = len;
	frame->final   = true;
	frame->op      = op;
	frame->head[0] = op | 0x80; // final frame (control)
	frame->head[1] = len & 0x7F;
	frame->hlen    = 2;
	frame->buf     = frame->sdata;
	frame->asize   = 0;

	if (ws->server) {
		frame->masked = false;
	} else {
		ws_mask_frame(frame);
	}

	*framep = frame;
	return (0);
}